

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utFBXImporterExporter.cpp
# Opt level: O1

void __thiscall
utFBXImporterExporter_importPhongMaterial_Test::TestBody
          (utFBXImporterExporter_importPhongMaterial_Test *this)

{
  bool bVar1;
  aiReturn aVar2;
  char *pcVar3;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar;
  aiColor3D c;
  float f;
  aiMaterial *mat;
  aiScene *scene;
  Importer importer;
  AssertHelper local_60;
  undefined1 local_58 [12];
  undefined4 uStack_4c;
  undefined1 local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  asStack_40 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  ai_real local_28;
  ai_real local_24;
  aiMaterial *local_20;
  aiScene *local_18;
  Importer local_10;
  
  Assimp::Importer::Importer(&local_10);
  local_18 = Assimp::Importer::ReadFile
                       (&local_10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/FBX/phong_cube.fbx"
                        ,0x400);
  local_58._0_8_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)local_48,"nullptr","scene",(void **)local_58,&local_18);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_58);
    if (asStack_40[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((asStack_40[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xca,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_30,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_30);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58._0_8_ + 8))();
      }
      local_58._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(asStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_48,"1u","scene->mNumMaterials",(uint *)local_58,
             &local_18->mNumMaterials);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_58);
    if (asStack_40[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((asStack_40[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xcb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_30,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_30);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58._0_8_ + 8))();
      }
      local_58._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(asStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_20 = *local_18->mMaterials;
  local_58._0_8_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiMaterial_const*>
            ((internal *)local_48,"nullptr","mat",(void **)local_58,&local_20);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_58);
    if (asStack_40[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((asStack_40[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xcd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_30,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_30);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58._0_8_ + 8))();
      }
      local_58._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(asStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_28 = 0.0;
  local_48 = (undefined1  [8])0x0;
  asStack_40[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_60.data_._0_4_ = aiGetMaterialColor(local_20,"$clr.diffuse",0,0,(aiColor4D *)local_48);
  local_30 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
  local_28 = asStack_40[0].ptr_._0_4_;
  local_48 = (undefined1  [8])((ulong)local_48 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            ((internal *)local_58,"mat->Get(\"$clr.diffuse\",0,0, c)","aiReturn_SUCCESS",
             (aiReturn *)&local_60,(aiReturn *)local_48);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_48);
    if ((undefined8 *)CONCAT44(uStack_4c,local_58._8_4_) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT44(uStack_4c,local_58._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xd2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_48 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_48 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_48 + 8))();
      }
      local_48 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58._0_8_ = &DAT_3e8000003f000000;
  local_58._8_4_ = 0.25;
  testing::internal::CmpHelperEQ<aiColor3D,aiColor3D>
            ((internal *)local_48,"c","aiColor3D(0.5, 0.25, 0.25)",(aiColor3D *)&local_30,
             (aiColor3D *)local_58);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_58);
    if (asStack_40[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((asStack_40[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xd3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58._0_8_ + 8))();
      }
      local_58._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(asStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48 = (undefined1  [8])0x0;
  asStack_40[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_60.data_._0_4_ = aiGetMaterialColor(local_20,"$clr.specular",0,0,(aiColor4D *)local_48);
  local_30 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
  local_28 = asStack_40[0].ptr_._0_4_;
  local_48 = (undefined1  [8])((ulong)local_48 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            ((internal *)local_58,"mat->Get(\"$clr.specular\",0,0, c)","aiReturn_SUCCESS",
             (aiReturn *)&local_60,(aiReturn *)local_48);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_48);
    if ((undefined8 *)CONCAT44(uStack_4c,local_58._8_4_) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT44(uStack_4c,local_58._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xd4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_48 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_48 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_48 + 8))();
      }
      local_48 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58._0_8_ = &DAT_3e8000003e800000;
  local_58._8_4_ = 0.5;
  testing::internal::CmpHelperEQ<aiColor3D,aiColor3D>
            ((internal *)local_48,"c","aiColor3D(0.25, 0.25, 0.5)",(aiColor3D *)&local_30,
             (aiColor3D *)local_58);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_58);
    if (asStack_40[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((asStack_40[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xd5,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58._0_8_ + 8))();
      }
      local_58._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(asStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  aVar2 = aiGetMaterialFloatArray(local_20,"$mat.shinpercent",0,0,&local_24,(uint *)0x0);
  local_58._0_4_ = aVar2;
  local_60.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            ((internal *)local_48,"mat->Get(\"$mat.shinpercent\",0,0, f)","aiReturn_SUCCESS",
             (aiReturn *)local_58,(aiReturn *)&local_60);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_58);
    if (asStack_40[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((asStack_40[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xd6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58._0_8_ + 8))();
      }
      local_58._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(asStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58._0_4_ = 0x3f000000;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)local_48,"f","0.5f",&local_24,(float *)local_58);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_58);
    if (asStack_40[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((asStack_40[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xd7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58._0_8_ + 8))();
      }
      local_58._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(asStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  aVar2 = aiGetMaterialFloatArray(local_20,"$mat.shininess",0,0,&local_24,(uint *)0x0);
  local_58._0_4_ = aVar2;
  local_60.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            ((internal *)local_48,"mat->Get(\"$mat.shininess\",0,0, f)","aiReturn_SUCCESS",
             (aiReturn *)local_58,(aiReturn *)&local_60);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_58);
    if (asStack_40[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((asStack_40[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xd8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58._0_8_ + 8))();
      }
      local_58._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(asStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58._0_4_ = 0x41200000;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)local_48,"f","10.0f",&local_24,(float *)local_58);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_58);
    if (asStack_40[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((asStack_40[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xd9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58._0_8_ + 8))();
      }
      local_58._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(asStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48 = (undefined1  [8])0x0;
  asStack_40[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_60.data_._0_4_ = aiGetMaterialColor(local_20,"$clr.ambient",0,0,(aiColor4D *)local_48);
  local_30 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
  local_28 = asStack_40[0].ptr_._0_4_;
  local_48 = (undefined1  [8])((ulong)local_48 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            ((internal *)local_58,"mat->Get(\"$clr.ambient\",0,0, c)","aiReturn_SUCCESS",
             (aiReturn *)&local_60,(aiReturn *)local_48);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_48);
    if ((undefined8 *)CONCAT44(uStack_4c,local_58._8_4_) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT44(uStack_4c,local_58._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xda,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_48 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_48 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_48 + 8))();
      }
      local_48 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58._0_8_ = &DAT_3e8000003e000000;
  local_58._8_4_ = 0.25;
  testing::internal::CmpHelperEQ<aiColor3D,aiColor3D>
            ((internal *)local_48,"c","aiColor3D(0.125, 0.25, 0.25)",(aiColor3D *)&local_30,
             (aiColor3D *)local_58);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_58);
    if (asStack_40[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((asStack_40[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xdb,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58._0_8_ + 8))();
      }
      local_58._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(asStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48 = (undefined1  [8])0x0;
  asStack_40[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_60.data_._0_4_ = aiGetMaterialColor(local_20,"$clr.emissive",0,0,(aiColor4D *)local_48);
  local_30 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
  local_28 = asStack_40[0].ptr_._0_4_;
  local_48 = (undefined1  [8])((ulong)local_48 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            ((internal *)local_58,"mat->Get(\"$clr.emissive\",0,0, c)","aiReturn_SUCCESS",
             (aiReturn *)&local_60,(aiReturn *)local_48);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_48);
    if ((undefined8 *)CONCAT44(uStack_4c,local_58._8_4_) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT44(uStack_4c,local_58._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xdc,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_48 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_48 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_48 + 8))();
      }
      local_48 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58._0_8_ = &DAT_3e0000003e800000;
  local_58._8_4_ = 0.25;
  testing::internal::CmpHelperEQ<aiColor3D,aiColor3D>
            ((internal *)local_48,"c","aiColor3D(0.25, 0.125, 0.25)",(aiColor3D *)&local_30,
             (aiColor3D *)local_58);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_58);
    if (asStack_40[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((asStack_40[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xdd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58._0_8_ + 8))();
      }
      local_58._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(asStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48 = (undefined1  [8])0x0;
  asStack_40[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_60.data_._0_4_ = aiGetMaterialColor(local_20,"$clr.transparent",0,0,(aiColor4D *)local_48);
  local_30 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
  local_28 = asStack_40[0].ptr_._0_4_;
  local_48 = (undefined1  [8])((ulong)local_48 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            ((internal *)local_58,"mat->Get(\"$clr.transparent\",0,0, c)","aiReturn_SUCCESS",
             (aiReturn *)&local_60,(aiReturn *)local_48);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_48);
    if ((undefined8 *)CONCAT44(uStack_4c,local_58._8_4_) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT44(uStack_4c,local_58._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xde,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_48 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_48 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_48 + 8))();
      }
      local_48 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58._0_8_ = &DAT_3f0000003f400000;
  local_58._8_4_ = 0.25;
  testing::internal::CmpHelperEQ<aiColor3D,aiColor3D>
            ((internal *)local_48,"c","aiColor3D(0.75, 0.5, 0.25)",(aiColor3D *)&local_30,
             (aiColor3D *)local_58);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_58);
    if (asStack_40[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((asStack_40[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xdf,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58._0_8_ + 8))();
      }
      local_58._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(asStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  aVar2 = aiGetMaterialFloatArray(local_20,"$mat.opacity",0,0,&local_24,(uint *)0x0);
  local_58._0_4_ = aVar2;
  local_60.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            ((internal *)local_48,"mat->Get(\"$mat.opacity\",0,0, f)","aiReturn_SUCCESS",
             (aiReturn *)local_58,(aiReturn *)&local_60);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_58);
    if (asStack_40[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((asStack_40[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xe0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58._0_8_ + 8))();
      }
      local_58._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(asStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58._0_4_ = 0x3f000000;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)local_48,"f","0.5f",&local_24,(float *)local_58);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_58);
    if (asStack_40[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((asStack_40[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xe1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58._0_8_ + 8))();
      }
      local_58._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(asStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Assimp::Importer::~Importer(&local_10);
  return;
}

Assistant:

TEST_F( utFBXImporterExporter, importPhongMaterial ) {
    Assimp::Importer importer;
    const aiScene *scene = importer.ReadFile( ASSIMP_TEST_MODELS_DIR "/FBX/phong_cube.fbx", aiProcess_ValidateDataStructure );
    EXPECT_NE( nullptr, scene );
    EXPECT_EQ( 1u, scene->mNumMaterials );
    const aiMaterial *mat = scene->mMaterials[0];
    EXPECT_NE( nullptr, mat );
    float f;
    aiColor3D c;

    // phong_cube.fbx has all properties defined
    EXPECT_EQ( mat->Get(AI_MATKEY_COLOR_DIFFUSE, c), aiReturn_SUCCESS );
    EXPECT_EQ( c, aiColor3D(0.5, 0.25, 0.25) );
    EXPECT_EQ( mat->Get(AI_MATKEY_COLOR_SPECULAR, c), aiReturn_SUCCESS );
    EXPECT_EQ( c, aiColor3D(0.25, 0.25, 0.5) );
    EXPECT_EQ( mat->Get(AI_MATKEY_SHININESS_STRENGTH, f), aiReturn_SUCCESS );
    EXPECT_EQ( f, 0.5f );
    EXPECT_EQ( mat->Get(AI_MATKEY_SHININESS, f), aiReturn_SUCCESS );
    EXPECT_EQ( f, 10.0f );
    EXPECT_EQ( mat->Get(AI_MATKEY_COLOR_AMBIENT, c), aiReturn_SUCCESS );
    EXPECT_EQ( c, aiColor3D(0.125, 0.25, 0.25) );
    EXPECT_EQ( mat->Get(AI_MATKEY_COLOR_EMISSIVE, c), aiReturn_SUCCESS );
    EXPECT_EQ( c, aiColor3D(0.25, 0.125, 0.25) );
    EXPECT_EQ( mat->Get(AI_MATKEY_COLOR_TRANSPARENT, c), aiReturn_SUCCESS );
    EXPECT_EQ( c, aiColor3D(0.75, 0.5, 0.25) );
    EXPECT_EQ( mat->Get(AI_MATKEY_OPACITY, f), aiReturn_SUCCESS );
    EXPECT_EQ( f, 0.5f );
}